

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O3

double __thiscall
chrono::fea::ChElementHexaANCF_3813_9::Calc_detJ0
          (ChElementHexaANCF_3813_9 *this,double x,double y,double z,ShapeVector *Nx,ShapeVector *Ny
          ,ShapeVector *Nz,ChMatrixNM<double,_1,_3> *Nx_d0,ChMatrixNM<double,_1,_3> *Ny_d0,
          ChMatrixNM<double,_1,_3> *Nz_d0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ActualDstType actualDst;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  
  ShapeFunctionsDerivativeX(this,Nx,x,y,z);
  ShapeFunctionsDerivativeY(this,Ny,x,y,z);
  ShapeFunctionsDerivativeZ(this,Nz,x,y,z);
  dVar1 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[1];
  auVar43._8_8_ = dVar1;
  auVar43._0_8_ = dVar1;
  dVar1 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[0];
  dVar2 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[1];
  dVar3 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[3];
  dVar4 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[4];
  dVar5 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[0];
  auVar25._8_8_ = dVar5;
  auVar25._0_8_ = dVar5;
  auVar25 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             (this->m_d0).
                             super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                             m_storage.m_data.array,auVar25);
  dVar5 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
          m_data.array[2];
  dVar6 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
          m_data.array[5];
  dVar7 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
          m_data.array[0xb];
  dVar8 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
          m_data.array[0xe];
  auVar25 = vfmadd132pd_fma(auVar43,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 3));
  dVar9 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[2];
  auVar26._8_8_ = dVar9;
  auVar26._0_8_ = dVar9;
  auVar25 = vfmadd132pd_fma(auVar26,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 6));
  dVar9 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[3];
  auVar44._8_8_ = dVar9;
  auVar44._0_8_ = dVar9;
  dVar9 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[2];
  dVar10 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[7];
  auVar25 = vfmadd132pd_fma(auVar44,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 9));
  dVar11 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[4];
  auVar27._8_8_ = dVar11;
  auVar27._0_8_ = dVar11;
  dVar11 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[8];
  dVar12 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x17];
  auVar25 = vfmadd132pd_fma(auVar27,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0xc));
  dVar13 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[5];
  auVar45._8_8_ = dVar13;
  auVar45._0_8_ = dVar13;
  auVar25 = vfmadd132pd_fma(auVar45,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0xf));
  dVar13 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[6];
  auVar28._8_8_ = dVar13;
  auVar28._0_8_ = dVar13;
  dVar13 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[6];
  dVar14 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x14];
  auVar25 = vfmadd132pd_fma(auVar28,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x12));
  dVar15 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[7];
  auVar46._8_8_ = dVar15;
  auVar46._0_8_ = dVar15;
  dVar15 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[5];
  dVar16 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x11];
  auVar25 = vfmadd132pd_fma(auVar46,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x15));
  dVar17 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[8];
  auVar29._8_8_ = dVar17;
  auVar29._0_8_ = dVar17;
  auVar25 = vfmadd132pd_fma(auVar29,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x18));
  dVar17 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[9];
  auVar47._8_8_ = dVar17;
  auVar47._0_8_ = dVar17;
  dVar17 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[9];
  dVar18 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x1d];
  auVar25 = vfmadd132pd_fma(auVar47,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x1b));
  dVar19 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[10];
  auVar30._8_8_ = dVar19;
  auVar30._0_8_ = dVar19;
  dVar20 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[8];
  dVar21 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x1a];
  auVar25 = vfmadd231pd_fma(auVar25,auVar30,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x1e));
  dVar22 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x20];
  *(undefined1 (*) [16])
   (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array =
       auVar25;
  (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[2] =
       dVar1 * dVar5 + dVar2 * dVar6 + dVar9 * dVar11 + dVar3 * dVar7 + dVar4 * dVar8 +
       dVar15 * dVar16 + dVar13 * dVar14 + dVar10 * dVar12 +
       dVar20 * dVar21 + dVar17 * dVar18 + dVar19 * dVar22;
  dVar1 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[1];
  auVar48._8_8_ = dVar1;
  auVar48._0_8_ = dVar1;
  dVar1 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[0];
  dVar2 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[1];
  dVar3 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[3];
  dVar4 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[4];
  dVar5 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[0];
  auVar23._8_8_ = dVar5;
  auVar23._0_8_ = dVar5;
  auVar25 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             (this->m_d0).
                             super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                             m_storage.m_data.array,auVar23);
  dVar5 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
          m_data.array[2];
  dVar6 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
          m_data.array[5];
  dVar7 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
          m_data.array[0xb];
  dVar8 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
          m_data.array[0xe];
  auVar25 = vfmadd132pd_fma(auVar48,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 3));
  dVar9 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[2];
  auVar31._8_8_ = dVar9;
  auVar31._0_8_ = dVar9;
  auVar25 = vfmadd132pd_fma(auVar31,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 6));
  dVar9 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[3];
  auVar49._8_8_ = dVar9;
  auVar49._0_8_ = dVar9;
  dVar9 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[2];
  dVar10 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[7];
  auVar25 = vfmadd132pd_fma(auVar49,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 9));
  dVar11 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[4];
  auVar32._8_8_ = dVar11;
  auVar32._0_8_ = dVar11;
  dVar11 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[8];
  dVar12 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x17];
  auVar25 = vfmadd132pd_fma(auVar32,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0xc));
  dVar13 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[5];
  auVar50._8_8_ = dVar13;
  auVar50._0_8_ = dVar13;
  auVar25 = vfmadd132pd_fma(auVar50,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0xf));
  dVar13 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[6];
  auVar33._8_8_ = dVar13;
  auVar33._0_8_ = dVar13;
  dVar13 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[6];
  dVar14 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x14];
  auVar25 = vfmadd132pd_fma(auVar33,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x12));
  dVar15 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[7];
  auVar51._8_8_ = dVar15;
  auVar51._0_8_ = dVar15;
  dVar15 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[5];
  dVar16 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x11];
  auVar25 = vfmadd132pd_fma(auVar51,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x15));
  dVar17 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[8];
  auVar34._8_8_ = dVar17;
  auVar34._0_8_ = dVar17;
  auVar25 = vfmadd132pd_fma(auVar34,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x18));
  dVar17 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[9];
  auVar52._8_8_ = dVar17;
  auVar52._0_8_ = dVar17;
  dVar17 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[9];
  dVar18 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x1d];
  auVar25 = vfmadd132pd_fma(auVar52,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x1b));
  dVar19 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[10];
  auVar35._8_8_ = dVar19;
  auVar35._0_8_ = dVar19;
  dVar20 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[8];
  dVar21 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x1a];
  auVar25 = vfmadd231pd_fma(auVar25,auVar35,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x1e));
  dVar22 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x20];
  *(undefined1 (*) [16])
   (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array =
       auVar25;
  (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[2] =
       dVar1 * dVar5 + dVar2 * dVar6 + dVar9 * dVar11 + dVar3 * dVar7 + dVar4 * dVar8 +
       dVar15 * dVar16 + dVar13 * dVar14 + dVar10 * dVar12 +
       dVar20 * dVar21 + dVar17 * dVar18 + dVar19 * dVar22;
  dVar1 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[1];
  auVar53._8_8_ = dVar1;
  auVar53._0_8_ = dVar1;
  dVar1 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[0];
  dVar2 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[1];
  dVar3 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[3];
  dVar4 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[4];
  dVar5 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[0];
  auVar24._8_8_ = dVar5;
  auVar24._0_8_ = dVar5;
  auVar25 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             (this->m_d0).
                             super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                             m_storage.m_data.array,auVar24);
  dVar5 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
          m_data.array[2];
  dVar6 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
          m_data.array[5];
  dVar7 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
          m_data.array[0xb];
  dVar8 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
          m_data.array[0xe];
  auVar25 = vfmadd132pd_fma(auVar53,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 3));
  dVar9 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[2];
  auVar36._8_8_ = dVar9;
  auVar36._0_8_ = dVar9;
  auVar25 = vfmadd132pd_fma(auVar36,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 6));
  dVar9 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[3];
  auVar54._8_8_ = dVar9;
  auVar54._0_8_ = dVar9;
  dVar9 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[2];
  dVar10 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[7];
  auVar25 = vfmadd132pd_fma(auVar54,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 9));
  dVar11 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[4];
  auVar37._8_8_ = dVar11;
  auVar37._0_8_ = dVar11;
  dVar11 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[8];
  dVar12 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x17];
  auVar25 = vfmadd132pd_fma(auVar37,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0xc));
  dVar13 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[5];
  auVar55._8_8_ = dVar13;
  auVar55._0_8_ = dVar13;
  auVar25 = vfmadd132pd_fma(auVar55,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0xf));
  dVar13 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[6];
  auVar38._8_8_ = dVar13;
  auVar38._0_8_ = dVar13;
  dVar13 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[6];
  dVar14 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x14];
  auVar25 = vfmadd132pd_fma(auVar38,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x12));
  dVar15 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[7];
  auVar56._8_8_ = dVar15;
  auVar56._0_8_ = dVar15;
  dVar15 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[5];
  dVar16 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x11];
  auVar25 = vfmadd132pd_fma(auVar56,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x15));
  dVar17 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[8];
  auVar39._8_8_ = dVar17;
  auVar39._0_8_ = dVar17;
  auVar25 = vfmadd132pd_fma(auVar39,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x18));
  dVar17 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[9];
  auVar57._8_8_ = dVar17;
  auVar57._0_8_ = dVar17;
  dVar17 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[9];
  dVar18 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x1d];
  auVar25 = vfmadd132pd_fma(auVar57,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x1b));
  dVar19 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[10];
  auVar40._8_8_ = dVar19;
  auVar40._0_8_ = dVar19;
  dVar20 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[8];
  dVar21 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x1a];
  auVar23 = vfmadd231pd_fma(auVar25,auVar40,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x1e));
  dVar22 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x20];
  *(undefined1 (*) [16])
   (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array =
       auVar23;
  auVar25 = vshufpd_avx(auVar23,auVar23,1);
  dVar7 = dVar1 * dVar5 + dVar2 * dVar6 + dVar9 * dVar11 + dVar3 * dVar7 + dVar4 * dVar8 +
          dVar15 * dVar16 + dVar13 * dVar14 + dVar10 * dVar12 +
          dVar20 * dVar21 + dVar17 * dVar18 + dVar19 * dVar22;
  (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[2] =
       dVar7;
  dVar1 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar1;
  dVar2 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar3 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar3;
  dVar4 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
  dVar5 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar6 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar6;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar7;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar3 * dVar2;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar1 * auVar25._0_8_ * dVar4;
  auVar24 = vfmadd231sd_fma(auVar64,auVar41,auVar62);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = auVar23._0_8_ * dVar5;
  auVar24 = vfmadd213sd_fma(auVar63,auVar65,auVar24);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar4 * dVar2;
  auVar23 = vfnmadd213sd_fma(auVar60,auVar23,auVar24);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar6 * auVar25._0_8_;
  auVar25 = vfnmadd213sd_fma(auVar58,auVar61,auVar23);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar5 * dVar7;
  auVar25 = vfnmadd213sd_fma(auVar42,auVar59,auVar25);
  return auVar25._0_8_;
}

Assistant:

double ChElementHexaANCF_3813_9::Calc_detJ0(double x,
                                            double y,
                                            double z,
                                            ShapeVector& Nx,
                                            ShapeVector& Ny,
                                            ShapeVector& Nz,
                                            ChMatrixNM<double, 1, 3>& Nx_d0,
                                            ChMatrixNM<double, 1, 3>& Ny_d0,
                                            ChMatrixNM<double, 1, 3>& Nz_d0) {
    ShapeFunctionsDerivativeX(Nx, x, y, z);
    ShapeFunctionsDerivativeY(Ny, x, y, z);
    ShapeFunctionsDerivativeZ(Nz, x, y, z);

    Nx_d0 = Nx * m_d0;
    Ny_d0 = Ny * m_d0;
    Nz_d0 = Nz * m_d0;

    double detJ0 = Nx_d0(0, 0) * Ny_d0(0, 1) * Nz_d0(0, 2) + Ny_d0(0, 0) * Nz_d0(0, 1) * Nx_d0(0, 2) +
                   Nz_d0(0, 0) * Nx_d0(0, 1) * Ny_d0(0, 2) - Nx_d0(0, 2) * Ny_d0(0, 1) * Nz_d0(0, 0) -
                   Ny_d0(0, 2) * Nz_d0(0, 1) * Nx_d0(0, 0) - Nz_d0(0, 2) * Nx_d0(0, 1) * Ny_d0(0, 0);

    return detJ0;
}